

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseUint128(char *s,char *end,v128 *out)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  if (s != end) {
    out->v[0] = '\0';
    out->v[1] = '\0';
    out->v[2] = '\0';
    out->v[3] = '\0';
    out->v[4] = '\0';
    out->v[5] = '\0';
    out->v[6] = '\0';
    out->v[7] = '\0';
    out->v[8] = '\0';
    out->v[9] = '\0';
    out->v[10] = '\0';
    out->v[0xb] = '\0';
    out->v[0xc] = '\0';
    out->v[0xd] = '\0';
    out->v[0xe] = '\0';
    out->v[0xf] = '\0';
    uVar7 = (int)*s - 0x30;
    if (uVar7 < 10) {
      uVar1 = *(uint *)out->v;
      pcVar4 = s + 1;
      iVar3 = 0;
      iVar8 = 0;
      iVar6 = 0;
      do {
        iVar10 = 0;
        uVar2 = uVar1 + uVar7;
        *(uint *)out->v = uVar2;
        if ((CARRY4(uVar1,uVar7)) && (iVar10 = 1, iVar8 == -1)) {
          out->v[4] = '\0';
          out->v[5] = '\0';
          out->v[6] = '\0';
          out->v[7] = '\0';
          if (iVar3 != -1) {
            iVar8 = 1;
            uVar7 = 0;
            goto LAB_0011d872;
          }
          out->v[8] = '\0';
          out->v[9] = '\0';
          out->v[10] = '\0';
          out->v[0xb] = '\0';
          if (iVar6 == -1) {
            out->v[0xc] = '\0';
            out->v[0xd] = '\0';
            out->v[0xe] = '\0';
            out->v[0xf] = '\0';
            return (Result)Error;
          }
          iVar10 = 1;
          uVar9 = 0;
          uVar7 = 0;
        }
        else {
          uVar7 = iVar10 + iVar8;
          *(uint *)(out->v + 4) = uVar7;
          iVar8 = 0;
LAB_0011d872:
          uVar9 = iVar8 + iVar3;
          *(uint *)(out->v + 8) = uVar9;
          iVar10 = 0;
        }
        *(int *)(out->v + 0xc) = iVar10 + iVar6;
        if (pcVar4 == end) {
          return (Result)Ok;
        }
        uVar5 = ((uVar2 >> 0x1d) - ((int)uVar2 >> 0x1f)) + (uint)CARRY4(uVar2 * 8,uVar2 * 2);
        uVar1 = uVar2 * 10;
        *(uint *)out->v = uVar1;
        iVar8 = uVar7 * 10 + uVar5;
        uVar7 = (uint)CARRY4(uVar7 * 8,uVar7 * 2) + ((uVar7 >> 0x1d) - ((int)uVar7 >> 0x1f)) +
                (uint)CARRY4(uVar7 * 10,uVar5);
        *(int *)(out->v + 4) = iVar8;
        iVar3 = uVar9 * 10 + uVar7;
        *(int *)(out->v + 8) = iVar3;
        iVar6 = (iVar10 + iVar6) * 10 +
                ((uVar9 >> 0x1d) - ((int)uVar9 >> 0x1f)) + (uint)CARRY4(uVar9 * 8,uVar9 * 2) +
                (uint)CARRY4(uVar9 * 10,uVar7);
        *(int *)(out->v + 0xc) = iVar6;
        uVar7 = (int)*pcVar4 - 0x30;
        pcVar4 = pcVar4 + 1;
      } while (uVar7 < 10);
    }
  }
  return (Result)Error;
}

Assistant:

Result ParseUint128(const char* s,
                    const char* end,
                    v128* out) {
  if (s == end) {
    return Result::Error;
  }

  out->set_zero();

  while (true) {
    uint32_t digit = (*s - '0');
    if (digit > 9) {
      return Result::Error;
    }

    uint32_t carry_into_v1 = 0;
    uint32_t carry_into_v2 = 0;
    uint32_t carry_into_v3 = 0;
    uint32_t overflow = 0;
    out->set_u32(0, AddWithCarry(out->u32(0), digit, &carry_into_v1));
    out->set_u32(1, AddWithCarry(out->u32(1), carry_into_v1, &carry_into_v2));
    out->set_u32(2, AddWithCarry(out->u32(2), carry_into_v2, &carry_into_v3));
    out->set_u32(3, AddWithCarry(out->u32(3), carry_into_v3, &overflow));
    if (overflow) {
      return Result::Error;
    }

    ++s;

    if (s == end) {
      break;
    }

    Mul10(out);
  }
  return Result::Ok;
}